

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

uint8_t __thiscall ymfm::ym2608::read_status_hi(ym2608 *this)

{
  byte bVar1;
  ymfm_interface *pyVar2;
  ulong uVar3;
  byte local_11;
  uint8_t adpcm_status;
  uint8_t status;
  ym2608 *this_local;
  
  local_11 = fm_engine_base<ymfm::opn_registers_base<true>_>::status
                       ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  local_11 = local_11 & 0xd3;
  bVar1 = adpcm_b_engine::status(&this->m_adpcm_b);
  if ((bVar1 & 1) != 0) {
    local_11 = local_11 | 4;
  }
  if ((bVar1 & 2) != 0) {
    local_11 = local_11 | 8;
  }
  if ((bVar1 & 4) != 0) {
    local_11 = local_11 | 0x20;
  }
  local_11 = local_11 & (this->m_flag_control & 0x1f ^ 0xff);
  fm_engine_base<ymfm::opn_registers_base<true>_>::set_reset_status
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,local_11,local_11 ^ 0xff
            );
  pyVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::intf
                     ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  uVar3 = (*(code *)pyVar2->m_engine[4]._vptr_ymfm_engine_callbacks)();
  if ((uVar3 & 1) != 0) {
    local_11 = local_11 | 0x80;
  }
  return local_11;
}

Assistant:

uint8_t ym2608::read_status_hi()
{
	// fetch regular status
	uint8_t status = m_fm.status() & ~(STATUS_ADPCM_B_EOS | STATUS_ADPCM_B_BRDY | STATUS_ADPCM_B_PLAYING);

	// fetch ADPCM-B status, and merge in the bits
	uint8_t adpcm_status = m_adpcm_b.status();
	if ((adpcm_status & adpcm_b_channel::STATUS_EOS) != 0)
		status |= STATUS_ADPCM_B_EOS;
	if ((adpcm_status & adpcm_b_channel::STATUS_BRDY) != 0)
		status |= STATUS_ADPCM_B_BRDY;
	if ((adpcm_status & adpcm_b_channel::STATUS_PLAYING) != 0)
		status |= STATUS_ADPCM_B_PLAYING;

	// turn off any bits that have been requested to be masked
	status &= ~(m_flag_control & 0x1f);

	// update the status so that IRQs are propagated
	m_fm.set_reset_status(status, ~status);

	// merge in the busy flag
	if (m_fm.intf().ymfm_is_busy())
		status |= fm_engine::STATUS_BUSY;
	return status;
}